

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeOneField
          (MessageGenerator *this,Printer *printer,FieldDescriptor *field,int cached_has_bits_index)

{
  FieldDescriptor FVar1;
  bool bVar2;
  int iVar3;
  FieldGenerator *pFVar4;
  byte bVar5;
  int iVar6;
  FieldDescriptor *field_00;
  _Alloc_hider _Var7;
  Hex hex;
  string mask;
  Formatter format;
  undefined1 local_b8 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  Formatter local_68;
  
  local_68.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_68.vars_._M_t,&(this->variables_)._M_t);
  if (*(char *)(*(long *)(field + 0x38) + 0x4f) == '\0') {
    PrintFieldComment<google::protobuf::FieldDescriptor>(&local_68,field);
  }
  if (*(char *)(*(long *)(field + 0x38) + 0x4f) == '\0') {
    FVar1 = field[1];
    if (((byte)FVar1 & 2) != 0) {
LAB_002b07a7:
      iVar3 = HasBitIndex(this,field);
      iVar6 = iVar3 + 0x1f;
      if (-1 < iVar3) {
        iVar6 = iVar3;
      }
      if (iVar6 >> 5 == cached_has_bits_index) {
        hex.value = (ulong)(uint)(1 << ((byte)iVar3 & 0x1f));
        hex._8_8_ = 8;
        strings::AlphaNum::AlphaNum((AlphaNum *)local_b8,hex);
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_88,local_b8._0_8_,(char *)(local_b8._0_8_ + local_b8._8_8_));
        Formatter::operator()(&local_68,"if (cached_has_bits & 0x$1$u) {\n",&local_88);
        _Var7._M_p = local_88._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
LAB_002b0845:
          operator_delete(_Var7._M_p);
        }
      }
      else {
        FieldName_abi_cxx11_((string *)local_b8,(cpp *)field,field_00);
        Formatter::operator()
                  (&local_68,"if (_internal_has_$1$()) {\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
        _Var7._M_p = (pointer)local_b8._0_8_;
        if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) goto LAB_002b0845;
      }
      bVar2 = true;
      io::Printer::Indent(local_68.printer_);
      goto LAB_002b0857;
    }
    bVar5 = (byte)FVar1 & 0x60;
    if ((bVar5 == 0x20) && (*(char *)(*(long *)(field + 0x10) + 0x3a) == '\x02')) {
      if ((((byte)FVar1 & 0x10) == 0) || (*(long *)(field + 0x28) == 0)) goto LAB_002b07a7;
    }
    else if (bVar5 == 0x40) goto LAB_002b07a7;
    if (bVar5 == 0x20) {
      if ((*(char *)(*(long *)(field + 0x10) + 0x3a) != '\x02') ||
         ((bVar2 = false, ((byte)FVar1 & 0x10) != 0 && (*(long *)(field + 0x28) != 0)))) {
        local_b8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_b8 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"this->","");
        bVar2 = anon_unknown_0::EmitFieldNonDefaultCondition(printer,(string *)local_b8,field);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_b8 + 0x10)) {
          operator_delete((void *)local_b8._0_8_);
        }
      }
      goto LAB_002b0857;
    }
  }
  bVar2 = false;
LAB_002b0857:
  pFVar4 = FieldGeneratorMap::get(&this->field_generators_,field);
  (*pFVar4->_vptr_FieldGenerator[0x13])(pFVar4,printer);
  if (bVar2 != false) {
    io::Printer::Outdent(local_68.printer_);
    Formatter::operator()<>(&local_68,"}\n");
  }
  Formatter::operator()<>(&local_68,"\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_68.vars_._M_t);
  return;
}

Assistant:

void MessageGenerator::GenerateSerializeOneField(io::Printer* printer,
                                                 const FieldDescriptor* field,
                                                 int cached_has_bits_index) {
  Formatter format(printer, variables_);
  if (!field->options().weak()) {
    // For weakfields, PrintFieldComment is called during iteration.
    PrintFieldComment(format, field);
  }

  bool have_enclosing_if = false;
  if (field->options().weak()) {
  } else if (HasHasbit(field)) {
    // Attempt to use the state of cached_has_bits, if possible.
    int has_bit_index = HasBitIndex(field);
    if (cached_has_bits_index == has_bit_index / 32) {
      const std::string mask =
          StrCat(strings::Hex(1u << (has_bit_index % 32), strings::ZERO_PAD_8));

      format("if (cached_has_bits & 0x$1$u) {\n", mask);
    } else {
      format("if (_internal_has_$1$()) {\n", FieldName(field));
    }

    format.Indent();
    have_enclosing_if = true;
  } else if (field->is_optional() && !HasHasbit(field)) {
    have_enclosing_if = EmitFieldNonDefaultCondition(printer, "this->", field);
  }

  field_generators_.get(field).GenerateSerializeWithCachedSizesToArray(printer);

  if (have_enclosing_if) {
    format.Outdent();
    format("}\n");
  }
  format("\n");
}